

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O0

int module_load(Server *server)

{
  Server *server_local;
  
  printf("Loading module FileServer...\n");
  load_file_into_mem();
  Server::insert_to_front_of_hook<HTTPResponse*(*)(Client*)>
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,http_request_handler);
  printf("Loaded module FileServer\n");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module FileServer...\n");
    load_file_into_mem();
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module FileServer\n");
    return 0;
}